

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O0

int main(void)

{
  PmError PVar1;
  int iVar2;
  PmQueue *q;
  long *msg2_00;
  long *peek;
  long msg2 [100];
  long msg [100];
  int local_1c;
  int i;
  PmQueue *queue;
  int msg_len;
  
  queue._0_4_ = 4;
  do {
    if (99 < (int)(uint)queue) {
      return 0;
    }
    q = Pm_QueueCreate(100,(uint)queue << 3);
    printf("msg_len = %d\n",(ulong)(uint)queue);
    if (q == (PmQueue *)0x0) {
      printf("Could not allocate queue\n");
      return 1;
    }
    printf("test 1\n");
    for (local_1c = 0; local_1c < 0x54d; local_1c = local_1c + 1) {
      make_msg(msg2 + 99,(uint)queue,local_1c);
      PVar1 = Pm_Enqueue(q,msg2 + 99);
      if (PVar1 != pmNoData) {
        printf("Pm_Enqueue error\n");
        return 1;
      }
      PVar1 = Pm_Dequeue(q,&peek);
      if (PVar1 != pmGotData) {
        printf("Pm_Dequeue error\n");
        return 1;
      }
      iVar2 = cmp_msg(msg2 + 99,(long *)&peek,(uint)queue,local_1c);
      if (iVar2 == 0) {
        return 1;
      }
    }
    printf("test 2\n");
    for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
      make_msg(msg2 + 99,(uint)queue,local_1c);
      PVar1 = Pm_Enqueue(q,msg2 + 99);
      if (PVar1 != pmNoData) {
        printf("Pm_Enqueue error\n");
        return 1;
      }
    }
    for (local_1c = 100; local_1c < 0x4d2; local_1c = local_1c + 1) {
      make_msg(msg2 + 99,(uint)queue,local_1c + -100);
      PVar1 = Pm_Dequeue(q,&peek);
      if (PVar1 != pmGotData) {
        printf("Pm_Dequeue error\n");
        return 1;
      }
      iVar2 = cmp_msg(msg2 + 99,(long *)&peek,(uint)queue,local_1c);
      if (iVar2 == 0) {
        return 1;
      }
      make_msg(msg2 + 99,(uint)queue,local_1c);
      PVar1 = Pm_Enqueue(q,msg2 + 99);
      if (PVar1 != pmNoData) {
        printf("Pm_Enqueue error\n");
        return 1;
      }
    }
    while (iVar2 = Pm_QueueEmpty(q), iVar2 == 0) {
      make_msg(msg2 + 99,(uint)queue,local_1c + -100);
      PVar1 = Pm_Dequeue(q,&peek);
      if (PVar1 != pmGotData) {
        printf("Pm_Dequeue error\n");
        return 1;
      }
      iVar2 = cmp_msg(msg2 + 99,(long *)&peek,(uint)queue,local_1c);
      if (iVar2 == 0) {
        return 1;
      }
      local_1c = local_1c + 1;
    }
    if (local_1c != 0x536) {
      printf("Message count error\n");
      return 1;
    }
    printf("test 3\n");
    for (local_1c = 0; local_1c < 0x6e; local_1c = local_1c + 1) {
      make_msg(msg2 + 99,(uint)queue,local_1c);
      PVar1 = Pm_Enqueue(q,msg2 + 99);
      if (PVar1 == pmBufferOverflow) break;
    }
    for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
      make_msg(msg2 + 99,(uint)queue,local_1c);
      PVar1 = Pm_Dequeue(q,&peek);
      if (PVar1 != pmGotData) {
        printf("Pm_Dequeue error\n");
        return 1;
      }
      iVar2 = cmp_msg(msg2 + 99,(long *)&peek,(uint)queue,local_1c);
      if (iVar2 == 0) {
        return 1;
      }
    }
    PVar1 = Pm_Dequeue(q,&peek);
    if (PVar1 != pmBufferOverflow) {
      printf("Pm_Dequeue overflow expected\n");
      return 1;
    }
    printf("test 4\n");
    for (local_1c = 0; local_1c < 0x54d; local_1c = local_1c + 1) {
      make_msg(msg2 + 99,(uint)queue,local_1c);
      PVar1 = Pm_Enqueue(q,msg2 + 99);
      if (PVar1 != pmNoData) {
        printf("Pm_Enqueue error\n");
        return 1;
      }
      msg2_00 = (long *)Pm_QueuePeek(q);
      iVar2 = cmp_msg(msg2 + 99,msg2_00,(uint)queue,local_1c);
      if (iVar2 == 0) {
        return 1;
      }
      PVar1 = Pm_Dequeue(q,&peek);
      if (PVar1 != pmGotData) {
        printf("Pm_Dequeue error\n");
        return 1;
      }
      iVar2 = cmp_msg(msg2 + 99,(long *)&peek,(uint)queue,local_1c);
      if (iVar2 == 0) {
        return 1;
      }
    }
    Pm_QueueDestroy(q);
    queue._0_4_ = (uint)queue + 5;
  } while( true );
}

Assistant:

int main()
{
    int msg_len;
    for (msg_len = 4; msg_len < 100; msg_len += 5) {
        PmQueue *queue = Pm_QueueCreate(100, msg_len * sizeof(long));
        int i;
        long msg[100];
        long msg2[100];

	printf("msg_len = %d\n", msg_len);
        if (!queue) {
            printf("Could not allocate queue\n");
            return 1;
        }
    
        /* insert/remove 1000 messages */
        printf("test 1\n");
        for (i = 0; i < 1357; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
    
        /* make full */
        printf("test 2\n");
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* alternately remove and insert */
        for (i = 100; i < 1234; i++) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* remove all */
        while (!Pm_QueueEmpty(queue)) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            i++;
        }
        if (i != 1334) {
            printf("Message count error\n");
	    return 1;
        }
    
        /* now test overflow */
        printf("test 3\n");
        for (i = 0; i < 110; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg) == pmBufferOverflow) {
	        break; /* this is supposed to execute after 100 messages */
            }
        }
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
		return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
	/* we should detect overflow after removing 100 messages */
        if (Pm_Dequeue(queue, msg2) != pmBufferOverflow) {
            printf("Pm_Dequeue overflow expected\n");
	    return 1;
        }
    
	/* after overflow is detected (and cleared), sender can
	 * send again
	 */
        /* see if function is restored, also test peek */
        printf("test 4\n");
        for (i = 0; i < 1357; i++) {
            long *peek;
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            peek = (long *) Pm_QueuePeek(queue);
            if (!cmp_msg(msg, peek, msg_len, i)) {
	        return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
	        return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
	        return 1;
            }
        }
        Pm_QueueDestroy(queue);
    }
    return 0;
}